

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

Rule * Parser::getRule(Rule *__return_storage_ptr__,int id)

{
  Node local_20;
  undefined1 local_15;
  int local_14;
  Rule *pRStack_10;
  int id_local;
  Rule *res;
  
  local_15 = 0;
  local_14 = id;
  pRStack_10 = __return_storage_ptr__;
  Rule::Rule(__return_storage_ptr__);
  std::vector<Parser::Node,_std::allocator<Parser::Node>_>::clear(&__return_storage_ptr__->rights);
  local_20 = getNode(local_14);
  std::vector<Parser::Node,_std::allocator<Parser::Node>_>::push_back
            (&__return_storage_ptr__->rights,&local_20);
  return __return_storage_ptr__;
}

Assistant:

Rule getRule(int id){
        Rule res;
        res.rights.clear();
        res.rights.push_back(getNode(id));
        return res;
    }